

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

lu_byte luaO_codeparam(uint p)

{
  lu_byte lVar1;
  uint uVar2;
  uint log;
  uint p_local;
  
  if (p < 0x60e00) {
    uVar2 = (p * 0x80 + 99) / 100;
    if (uVar2 < 0x10) {
      log._3_1_ = (byte)uVar2;
    }
    else {
      lVar1 = luaO_ceillog2(uVar2 + 1);
      log._3_1_ = (char)(uVar2 >> (lVar1 - 5 & 0x1f)) - 0x10U | (lVar1 + 0xfc) * '\x10';
    }
  }
  else {
    log._3_1_ = 0xff;
  }
  return log._3_1_;
}

Assistant:

lu_byte luaO_codeparam (unsigned int p) {
  if (p >= (cast(lu_mem, 0x1F) << (0xF - 7 - 1)) * 100u)  /* overflow? */
    return 0xFF;  /* return maximum value */
  else {
    p = (cast(l_uint32, p) * 128 + 99) / 100;  /* round up the division */
    if (p < 0x10) {  /* subnormal number? */
      /* exponent bits are already zero; nothing else to do */
      return cast_byte(p);
    }
    else {  /* p >= 0x10 implies ceil(log2(p + 1)) >= 5 */
      /* preserve 5 bits in 'p' */
      unsigned log = luaO_ceillog2(p + 1) - 5u;
      return cast_byte(((p >> log) - 0x10) | ((log + 1) << 4));
    }
  }
}